

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
exponential_search_lower_bound<double>
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
           *this,int m,double *key)

{
  double dVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  piVar2 = this->key_slots_;
  dVar1 = *key;
  if ((double)piVar2[m] < dVar1) {
    lVar4 = this->num_exp_search_iterations_;
    iVar6 = this->data_capacity_ - m;
    iVar3 = 1;
    while( true ) {
      lVar4 = lVar4 + 1;
      if ((iVar6 <= iVar3) || (dVar1 <= (double)piVar2[iVar3 + m])) break;
      this->num_exp_search_iterations_ = lVar4;
      iVar3 = iVar3 * 2;
    }
    iVar5 = iVar3 / 2 + m;
    if (iVar6 < iVar3) {
      iVar3 = iVar6;
    }
  }
  else {
    lVar4 = this->num_exp_search_iterations_;
    iVar3 = 1;
    while( true ) {
      lVar4 = lVar4 + 1;
      if ((m - iVar3 == 0 || m < iVar3) || ((double)piVar2[m - iVar3] < dVar1)) break;
      this->num_exp_search_iterations_ = lVar4;
      iVar3 = iVar3 * 2;
    }
    iVar5 = m;
    if (iVar3 < m) {
      iVar5 = iVar3;
    }
    iVar5 = m - iVar5;
    iVar3 = iVar3 / -2;
  }
  iVar3 = binary_search_lower_bound<double>(this,iVar5,iVar3 + m,key);
  return iVar3;
}

Assistant:

inline int exponential_search_lower_bound(int m, const K& key) {
    // Continue doubling the bound until it contains the lower bound. Then use
    // binary search.
    int bound = 1;
    int l, r;  // will do binary search in range [l, r)
    if (key_greaterequal(ALEX_DATA_NODE_KEY_AT(m), key)) {
      int size = m;
      while (bound < size &&
             key_greaterequal(ALEX_DATA_NODE_KEY_AT(m - bound), key)) {
        bound *= 2;
        num_exp_search_iterations_++;
      }
      l = m - std::min<int>(bound, size);
      r = m - bound / 2;
    } else {
      int size = data_capacity_ - m;
      while (bound < size && key_less(ALEX_DATA_NODE_KEY_AT(m + bound), key)) {
        bound *= 2;
        num_exp_search_iterations_++;
      }
      l = m + bound / 2;
      r = m + std::min<int>(bound, size);
    }
    return binary_search_lower_bound(l, r, key);
  }